

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

bool_t prf_group_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  uint uVar1;
  ushort uVar2;
  uint len;
  bool_t bVar3;
  
  if (node->opcode == prf_group_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    buffer = node->data;
    bf_write(bfile,buffer,8);
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 8));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 10));
    bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 0xc));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x10));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x12));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x14));
    bf_put_int8(bfile,buffer[0x16]);
    bf_put_int8(bfile,buffer[0x17]);
    uVar2 = node->length;
    if (uVar2 < 0x20) {
      uVar1 = 0x1c;
    }
    else {
      bf_put_int32_be(bfile,*(int32_t *)(buffer + 0x18));
      uVar2 = node->length;
      uVar1 = 0x20;
    }
    bVar3 = 1;
    len = uVar2 - uVar1;
    if (uVar1 <= uVar2 && len != 0) {
      bf_write(bfile,node->data + ((ulong)uVar1 - 4),len);
    }
  }
  else {
    bVar3 = 0;
    prf_error(3,"tried group save method on node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_group_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_group_info.opcode ) {
        prf_error( 3, "tried group save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        bf_write( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        bf_put_int16_be( bfile, data->relative_priority ); pos += 2;
        bf_put_int16_be( bfile, data->reserved1 ); pos += 2;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        bf_put_int16_be( bfile, data->special_effect_id1 ); pos += 2;
        bf_put_int16_be( bfile, data->special_effect_id2 ); pos += 2;
        bf_put_int16_be( bfile, data->significance ); pos += 2;
        bf_put_int8( bfile, data->layer_code ); pos += 1;
        bf_put_int8( bfile, data->reserved2 ); pos += 1;
        if ( node->length < (pos + 4) ) break;
        bf_put_int32_be( bfile, data->reserved3 ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}